

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_Join::test_method(util_Join *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 op_upper;
  char *in_stack_fffffffffffff898;
  char *in_stack_fffffffffffff8a0;
  char *in_stack_fffffffffffff8a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff8b0;
  const_string *in_stack_fffffffffffff8c0;
  allocator_type *in_stack_fffffffffffff8c8;
  const_string *in_stack_fffffffffffff8d0;
  allocator<char> *in_stack_fffffffffffff8d8;
  iterator in_stack_fffffffffffff8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8e8;
  undefined1 *local_698;
  undefined1 *local_630;
  undefined1 *local_5a8;
  undefined1 *local_540;
  allocator<char> local_422;
  allocator<char> local_421;
  undefined1 local_420 [24];
  undefined1 local_408 [16];
  undefined1 local_3f8 [71];
  allocator<char> local_3b1;
  undefined1 local_3b0 [24];
  undefined1 local_398 [16];
  undefined1 local_388 [64];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined1 local_328 [16];
  undefined1 local_318 [68];
  undefined1 local_2d4;
  allocator<char> local_2d2;
  allocator<char> local_2d1 [25];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [71];
  allocator<char> local_261 [25];
  undefined1 local_248 [16];
  undefined1 local_238 [64];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [64];
  undefined1 local_188 [64];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [64];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
               (size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a0,(char (*) [1])in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1e8 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff898);
    util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
              (in_stack_fffffffffffff8b0,(char (*) [3])in_stack_fffffffffffff8a8);
    in_stack_fffffffffffff8a8 = "\"\"";
    in_stack_fffffffffffff8a0 = "";
    in_stack_fffffffffffff898 = "Join(std::vector<std::string>{}, \", \")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_1c8,local_1d8,0x11b,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff898);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff8a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
               (size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a0,(char (*) [1])in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8
              );
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff898);
    __l._M_len = (size_type)in_stack_fffffffffffff8e8;
    __l._M_array = in_stack_fffffffffffff8e0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff8d8,__l,(allocator_type *)in_stack_fffffffffffff8d0);
    util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
              (in_stack_fffffffffffff8b0,(char (*) [3])in_stack_fffffffffffff8a8);
    in_stack_fffffffffffff8a8 = "\"foo\"";
    in_stack_fffffffffffff8a0 = "foo";
    in_stack_fffffffffffff898 = "Join(std::vector<std::string>{\"foo\"}, \", \")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_238,local_248,0x11c,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff898);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff8a8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff898);
    local_540 = local_48;
    do {
      local_540 = local_540 + -0x20;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff898);
    } while (local_540 != local_68);
    std::allocator<char>::~allocator(local_261);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
               (size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a0,(char (*) [1])in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8
              );
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff898);
    __l_00._M_len = (size_type)in_stack_fffffffffffff8e8;
    __l_00._M_array = in_stack_fffffffffffff8e0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff8d8,__l_00,(allocator_type *)in_stack_fffffffffffff8d0);
    util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
              (in_stack_fffffffffffff8b0,(char (*) [3])in_stack_fffffffffffff8a8);
    in_stack_fffffffffffff8a8 = "\"foo, bar\"";
    in_stack_fffffffffffff8a0 = "foo, bar";
    in_stack_fffffffffffff898 = "Join(std::vector<std::string>{\"foo\", \"bar\"}, \", \")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
              (local_2a8,local_2b8,0x11d,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff898);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff8a8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff898);
    local_5a8 = local_88;
    do {
      local_5a8 = local_5a8 + -0x20;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff898);
    } while (local_5a8 != local_c8);
    std::allocator<char>::~allocator(&local_2d2);
    std::allocator<char>::~allocator(local_2d1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_2d4 = 0;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
               (size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a0,(char (*) [1])in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    local_348 = 0;
    uStack_340 = 0;
    local_338 = 0;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff898);
    util::
    Join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util_tests::util_Join::test_method()::__0>
              (local_e8,&local_348,", ");
    in_stack_fffffffffffff8a8 = "\"\"";
    in_stack_fffffffffffff8a0 = "";
    in_stack_fffffffffffff898 = "Join(std::list<std::string>{}, \", \", op_upper)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_318,local_328,0x121,1,2,local_e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff898);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff898);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
               (size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a0,(char (*) [1])in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8
              );
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff898);
    __l_01._M_len = (size_type)in_stack_fffffffffffff8e8;
    __l_01._M_array = in_stack_fffffffffffff8e0;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff8d0,__l_01,in_stack_fffffffffffff8c8);
    util::
    Join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util_tests::util_Join::test_method()::__0>
              (local_108,local_3b0,", ");
    in_stack_fffffffffffff8a8 = "\"FOO\"";
    in_stack_fffffffffffff8a0 = "FOO";
    in_stack_fffffffffffff898 = "Join(std::list<std::string>{\"foo\"}, \", \", op_upper)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_388,local_398,0x122,1,2,local_108);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff898);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff898);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff898);
    local_630 = local_108;
    do {
      local_630 = local_630 + -0x20;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff898);
    } while (local_630 != local_128);
    std::allocator<char>::~allocator(&local_3b1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
               (size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a0,(char (*) [1])in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
               (unsigned_long)in_stack_fffffffffffff898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8
              );
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff898);
    __l_02._M_len = (size_type)in_stack_fffffffffffff8e8;
    __l_02._M_array = in_stack_fffffffffffff8e0;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff8d0,__l_02,in_stack_fffffffffffff8c8);
    util::
    Join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util_tests::util_Join::test_method()::__0>
              (local_148,local_420,", ");
    in_stack_fffffffffffff8a8 = "\"FOO, BAR\"";
    in_stack_fffffffffffff8a0 = "FOO, BAR";
    in_stack_fffffffffffff898 = "Join(std::list<std::string>{\"foo\", \"bar\"}, \", \", op_upper)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
              (local_3f8,local_408,0x123,1,2,local_148);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff898);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff898);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff898);
    local_698 = local_148;
    do {
      local_698 = local_698 + -0x20;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff898);
    } while (local_698 != local_188);
    std::allocator<char>::~allocator(&local_422);
    std::allocator<char>::~allocator(&local_421);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_Join)
{
    // Normal version
    BOOST_CHECK_EQUAL(Join(std::vector<std::string>{}, ", "), "");
    BOOST_CHECK_EQUAL(Join(std::vector<std::string>{"foo"}, ", "), "foo");
    BOOST_CHECK_EQUAL(Join(std::vector<std::string>{"foo", "bar"}, ", "), "foo, bar");

    // Version with unary operator
    const auto op_upper = [](const std::string& s) { return ToUpper(s); };
    BOOST_CHECK_EQUAL(Join(std::list<std::string>{}, ", ", op_upper), "");
    BOOST_CHECK_EQUAL(Join(std::list<std::string>{"foo"}, ", ", op_upper), "FOO");
    BOOST_CHECK_EQUAL(Join(std::list<std::string>{"foo", "bar"}, ", ", op_upper), "FOO, BAR");
}